

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

raw_sstring_view
pstore::get_unique_sstring_view
          (database *db,address addr,size_t length,
          not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*>
          owner)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  raw_sstring_view rVar4;
  _Tuple_impl<1UL,_void_(*)(const_char_*)> local_30;
  char *local_28;
  
  uVar2 = 9;
  if (length >> 0x38 == 0) {
    uVar2 = bit_count::clz(length | 1);
    uVar2 = (0x3f - uVar2) / 7 + 1;
  }
  uVar3 = 2;
  if (2 < uVar2) {
    uVar3 = (ulong)uVar2;
  }
  (*db->_vptr_database[3])(&local_30,db,uVar3 + addr.a_,length,1);
  pcVar1 = ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>._M_t.
           super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
           super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = local_28;
  if (pcVar1 != (char *)0x0) {
    (*(_func_void_char_ptr *)
      ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>._M_t.
      super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
      super__Tuple_impl<1UL,_void_(*)(const_char_*)>.
      super__Head_base<1UL,_void_(*)(const_char_*),_false>)();
  }
  ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>._M_t.
  super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_char_*)>.
  super__Head_base<1UL,_void_(*)(const_char_*),_false> =
       local_30.super__Head_base<1UL,_void_(*)(const_char_*),_false>._M_head_impl;
  (owner.ptr_)->size_ = length;
  rVar4.size_ = length;
  rVar4.ptr_ = ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>.
               _M_t.super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
               super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  return rVar4;
}

Assistant:

raw_sstring_view
    get_unique_sstring_view (database const & db, address const addr, std::size_t const length,
                             gsl::not_null<unique_pointer_sstring_view *> const owner) {
        *owner = unique_pointer_sstring_view{
            db.getrou (
                typed_address<char>::make (addr + std::max (varint::encoded_size (length), 2U)),
                length),
            length};
        return {owner->data (), length};
    }